

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegendSpecs.hpp
# Opt level: O2

void __thiscall sciplot::LegendSpecs::LegendSpecs(LegendSpecs *this)

{
  allocator<char> local_69 [25];
  string local_50;
  
  *(undefined ***)
   &(this->super_TextSpecsOf<sciplot::LegendSpecs>).super_FontSpecsOf<sciplot::LegendSpecs> =
       &PTR__Specs_001afbc0;
  TextSpecsOf<sciplot::LegendSpecs>::TextSpecsOf
            (&this->super_TextSpecsOf<sciplot::LegendSpecs>,&PTR_PTR_001ad150);
  *(undefined8 *)&this->super_ShowSpecsOf<sciplot::LegendSpecs> = 0x1ad2b8;
  *(undefined8 *)
   &(this->super_TextSpecsOf<sciplot::LegendSpecs>).super_FontSpecsOf<sciplot::LegendSpecs> =
       0x1ad2f0;
  (this->super_ShowSpecsOf<sciplot::LegendSpecs>).m_show = true;
  TitleSpecsOf<sciplot::LegendSpecs>::TitleSpecsOf
            (&this->super_TitleSpecsOf<sciplot::LegendSpecs>,&PTR_construction_vtable_40__001ad180);
  FrameSpecsOf<sciplot::LegendSpecs>::FrameSpecsOf
            (&this->super_FrameSpecsOf<sciplot::LegendSpecs>,&PTR_construction_vtable_40__001ad190);
  *(undefined ***)
   &(this->super_TextSpecsOf<sciplot::LegendSpecs>).super_FontSpecsOf<sciplot::LegendSpecs> =
       &PTR__LegendSpecs_001ad070;
  *(undefined ***)&this->super_ShowSpecsOf<sciplot::LegendSpecs> = &PTR__LegendSpecs_001ad0b0;
  *(undefined ***)&this->super_TitleSpecsOf<sciplot::LegendSpecs> = &PTR__LegendSpecs_001ad0f0;
  *(undefined ***)&this->super_FrameSpecsOf<sciplot::LegendSpecs> = &PTR__LegendSpecs_001ad130;
  (this->m_placement)._M_dataplus._M_p = (pointer)&(this->m_placement).field_2;
  (this->m_placement)._M_string_length = 0;
  (this->m_placement).field_2._M_local_buf[0] = '\0';
  (this->m_opaque)._M_dataplus._M_p = (pointer)&(this->m_opaque).field_2;
  (this->m_opaque)._M_string_length = 0;
  (this->m_opaque).field_2._M_local_buf[0] = '\0';
  (this->m_alignment)._M_dataplus._M_p = (pointer)&(this->m_alignment).field_2;
  (this->m_alignment)._M_string_length = 0;
  (this->m_alignment).field_2._M_local_buf[0] = '\0';
  (this->m_reverse)._M_dataplus._M_p = (pointer)&(this->m_reverse).field_2;
  (this->m_reverse)._M_string_length = 0;
  (this->m_reverse).field_2._M_local_buf[0] = '\0';
  (this->m_invert)._M_dataplus._M_p = (pointer)&(this->m_invert).field_2;
  (this->m_invert)._M_string_length = 0;
  (this->m_invert).field_2._M_local_buf[0] = '\0';
  (this->m_justification)._M_dataplus._M_p = (pointer)&(this->m_justification).field_2;
  (this->m_justification)._M_string_length = 0;
  (this->m_justification).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_title_loc,"left",local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_maxrows,"auto",local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_maxcols,"auto",local_69);
  atTopRight(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",local_69);
  TitleSpecsOf<sciplot::LegendSpecs>::title
            (&this->super_TitleSpecsOf<sciplot::LegendSpecs>,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this->m_width_increment = 0;
  this->m_height_increment = 1;
  this->m_samplen = 4;
  this->m_spacing = 1;
  displayVertical(this);
  displayLabelsAfterSymbols(this);
  displayJustifyLeft(this);
  displayStartFromFirst(this);
  opaque(this);
  return;
}

Assistant:

inline LegendSpecs::LegendSpecs()
{
    atTopRight();
    title("");
    displayExpandWidthBy(internal::DEFAULT_LEGEND_FRAME_EXTRA_WIDTH);
    displayExpandHeightBy(internal::DEFAULT_LEGEND_FRAME_EXTRA_HEIGHT);
    displaySymbolLength(internal::DEFAULT_LEGEND_SAMPLE_LENGTH);
    displaySpacing(internal::DEFAULT_LEGEND_SPACING);
    displayVertical();
    displayLabelsAfterSymbols();
    displayJustifyLeft();
    displayStartFromFirst();
    opaque();
}